

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

string * __thiscall
polyscope::deviceBufferTypeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,DeviceBufferType *d)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "Attribute";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "Texture1d";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "Texture2d";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "Texture3d";
    pcVar2 = "";
    break;
  default:
    pcVar2 = "";
    pcVar3 = pcVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string deviceBufferTypeName(const DeviceBufferType& d) {
  switch (d) {
  case DeviceBufferType::Attribute:
    return "Attribute";
  case DeviceBufferType::Texture1d:
    return "Texture1d";
  case DeviceBufferType::Texture2d:
    return "Texture2d";
  case DeviceBufferType::Texture3d:
    return "Texture3d";
  }
  return "";
}